

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O2

void __thiscall
btVector3::getSkewSymmetricMatrix(btVector3 *this,btVector3 *v0,btVector3 *v1,btVector3 *v2)

{
  btScalar bVar1;
  
  bVar1 = this->m_floats[2];
  v0->m_floats[0] = 0.0;
  v0->m_floats[1] = -bVar1;
  v0->m_floats[2] = this->m_floats[1];
  v0->m_floats[3] = 0.0;
  bVar1 = this->m_floats[0];
  v1->m_floats[0] = this->m_floats[2];
  v1->m_floats[1] = 0.0;
  v1->m_floats[2] = -bVar1;
  v1->m_floats[3] = 0.0;
  v2->m_floats[0] = -this->m_floats[1];
  v2->m_floats[1] = this->m_floats[0];
  v2->m_floats[2] = 0.0;
  v2->m_floats[3] = 0.0;
  return;
}

Assistant:

void	getSkewSymmetricMatrix(btVector3* v0,btVector3* v1,btVector3* v2) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)

		__m128 V  = _mm_and_ps(mVec128, btvFFF0fMask);
		__m128 V0 = _mm_xor_ps(btvMzeroMask, V);
		__m128 V2 = _mm_movelh_ps(V0, V);

		__m128 V1 = _mm_shuffle_ps(V, V0, 0xCE);

        V0 = _mm_shuffle_ps(V0, V, 0xDB);
		V2 = _mm_shuffle_ps(V2, V, 0xF9);

		v0->mVec128 = V0;
		v1->mVec128 = V1;
		v2->mVec128 = V2;
#else
		v0->setValue(0.		,-z()		,y());
		v1->setValue(z()	,0.			,-x());
		v2->setValue(-y()	,x()	,0.);
#endif
	}